

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_hint_init(CF2_Hint hint,CF2_ArrStack stemHintArray,size_t indexStemHint,CF2_Font font,
                  CF2_F16Dot16 hintOrigin,CF2_F16Dot16 scale,FT_Bool bottom)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  hint->csCoord = 0;
  hint->dsCoord = 0;
  *(undefined8 *)&hint->scale = 0;
  *(undefined8 *)hint = 0;
  hint->index = 0;
  pcVar3 = (char *)cf2_arrstack_getPointer(stemHintArray,indexStemHint);
  iVar7 = *(int *)(pcVar3 + 4);
  iVar1 = *(int *)(pcVar3 + 8);
  iVar6 = iVar1 - iVar7;
  if (iVar6 == -0x140000) {
    if (bottom == '\0') {
      hint->csCoord = iVar7;
      uVar4 = 2;
LAB_001521b0:
      hint->flags = uVar4;
      iVar7 = font->darkenY * 2 + hint->csCoord;
      lVar5 = 0x10;
      bVar2 = false;
      goto LAB_001521c5;
    }
LAB_00152174:
    bVar2 = true;
    uVar4 = 0;
  }
  else {
    if (iVar6 == -0x150000) {
      if (bottom == '\0') goto LAB_00152174;
      hint->csCoord = iVar1;
      uVar4 = 1;
    }
    else {
      if (iVar6 < 0) {
        if (bottom == '\0') {
          hint->csCoord = iVar7;
          goto LAB_001521ae;
        }
        hint->csCoord = iVar1;
      }
      else {
        if (bottom == '\0') {
          hint->csCoord = iVar1;
LAB_001521ae:
          uVar4 = 8;
          goto LAB_001521b0;
        }
        hint->csCoord = iVar7;
      }
      uVar4 = 4;
    }
    bVar2 = false;
  }
  hint->flags = uVar4;
  iVar7 = hint->csCoord;
  lVar5 = 0xc;
LAB_001521c5:
  hint->csCoord = iVar7 + hintOrigin;
  hint->scale = scale;
  hint->index = indexStemHint;
  if ((bVar2) || (*pcVar3 == '\0')) {
    lVar5 = (long)scale * (long)(iVar7 + hintOrigin);
    hint->dsCoord = (CF2_F16Dot16)((ulong)((lVar5 >> 0x3f) + lVar5 + 0x8000) >> 0x10);
  }
  else {
    hint->dsCoord = *(CF2_F16Dot16 *)(pcVar3 + lVar5);
    hint->flags = uVar4 | 0x10;
  }
  return;
}

Assistant:

static void
  cf2_hint_init( CF2_Hint            hint,
                 const CF2_ArrStack  stemHintArray,
                 size_t              indexStemHint,
                 const CF2_Font      font,
                 CF2_Fixed           hintOrigin,
                 CF2_Fixed           scale,
                 FT_Bool             bottom )
  {
    CF2_Fixed               width;
    const CF2_StemHintRec*  stemHint;


    FT_ZERO( hint );

    stemHint = (const CF2_StemHintRec*)cf2_arrstack_getPointer(
                                         stemHintArray,
                                         indexStemHint );

    width = SUB_INT32( stemHint->max, stemHint->min );

    if ( width == cf2_intToFixed( -21 ) )
    {
      /* ghost bottom */

      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_GhostBottom;
      }
      else
        hint->flags = 0;
    }

    else if ( width == cf2_intToFixed( -20 ) )
    {
      /* ghost top */

      if ( bottom )
        hint->flags = 0;
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_GhostTop;
      }
    }

    else if ( width < 0 )
    {
      /* inverted pair */

      /*
       * Hints with negative widths were produced by an early version of a
       * non-Adobe font tool.  The Type 2 spec allows edge (ghost) hints
       * with negative widths, but says
       *
       *   All other negative widths have undefined meaning.
       *
       * CoolType has a silent workaround that negates the hint width; for
       * permissive mode, we do the same here.
       *
       * Note: Such fonts cannot use ghost hints, but should otherwise work.
       * Note: Some poor hints in our faux fonts can produce negative
       *       widths at some blends.  For example, see a light weight of
       *       `u' in ASerifMM.
       *
       */
      if ( bottom )
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairTop;
      }
    }

    else
    {
      /* normal pair */

      if ( bottom )
      {
        hint->csCoord = stemHint->min;
        hint->flags   = CF2_PairBottom;
      }
      else
      {
        hint->csCoord = stemHint->max;
        hint->flags   = CF2_PairTop;
      }
    }

    /* Now that ghost hints have been detected, adjust this edge for      */
    /* darkening.  Bottoms are not changed; tops are incremented by twice */
    /* `darkenY'.                                                         */
    if ( cf2_hint_isTop( hint ) )
      hint->csCoord = ADD_INT32( hint->csCoord, 2 * font->darkenY );

    hint->csCoord = ADD_INT32( hint->csCoord, hintOrigin );
    hint->scale   = scale;
    hint->index   = indexStemHint;   /* index in original stem hint array */

    /* if original stem hint has been used, use the same position */
    if ( hint->flags != 0 && stemHint->used )
    {
      if ( cf2_hint_isTop( hint ) )
        hint->dsCoord = stemHint->maxDS;
      else
        hint->dsCoord = stemHint->minDS;

      cf2_hint_lock( hint );
    }
    else
      hint->dsCoord = FT_MulFix( hint->csCoord, scale );
  }